

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O1

decimal128_from_chars_result
jsoncons::bson::decimal128_from_chars(char *first,char *last,decimal128_t *dec)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  short *psVar5;
  undefined8 uVar6;
  char cVar7;
  byte bVar8;
  long lVar9;
  decimal128_t *pdVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  uint64_t left;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  undefined8 unaff_R12;
  char cVar19;
  char *pcVar20;
  char *pcVar21;
  short *psVar22;
  bool bVar23;
  decimal128_from_chars_result dVar24;
  type tVar25;
  bson_uint128_6464_t significand;
  uint16_t digits [34];
  int local_c4;
  char *local_c0;
  short *local_b8;
  undefined8 local_b0;
  decimal128_t *local_a8;
  char *local_a0;
  ulong local_98;
  long local_90;
  bson_uint128_6464_t local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_88.high = 0;
  local_88.low = 0;
  psVar22 = (short *)0x0;
  local_38 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_c4 = 0;
  dec->low = 0;
  dec->high = 0;
  cVar7 = *first;
  if ((cVar7 == '-') || (cVar7 == '+')) {
    uVar6 = CONCAT71((int7)((ulong)unaff_R12 >> 8),cVar7 == '-');
    psVar22 = (short *)0x1;
    pcVar21 = first + 1;
  }
  else {
    uVar6 = 0;
    pcVar21 = first;
  }
  local_c0 = last;
  if (first[(long)psVar22] == 0x2e || (int)first[(long)psVar22] - 0x30U < 10) {
    uVar2 = (uint)first[(long)psVar22];
    bVar23 = uVar2 == 0x2e;
    if (bVar23 || uVar2 - 0x30 < 10) {
      lVar9 = 0;
      bVar11 = false;
      lVar13 = 0;
      local_a8 = (decimal128_t *)0x0;
      local_a0 = (char *)0x0;
      local_90 = 0;
      uVar4 = 0;
      psVar5 = (short *)&local_78;
      do {
        while( true ) {
          pcVar20 = pcVar21 + 1;
          bVar8 = (byte)lVar9;
          if (((long)last - (long)first != -1) && (last <= pcVar21)) goto LAB_00207c8e;
          if (!bVar23) break;
          if (lVar9 != 0) {
            dec->low = 0;
            goto LAB_00207cac;
          }
          uVar2 = (uint)*pcVar20;
          bVar23 = uVar2 == 0x2e;
          lVar9 = 1;
          pcVar21 = pcVar20;
          if (9 < uVar2 - 0x30 && !bVar23) {
            bVar8 = 1;
            goto LAB_00207c8e;
          }
        }
        local_b8 = psVar5;
        if (((ushort)uVar4 < 0x22) && (((char)uVar2 != '0' || (bVar11)))) {
          if (bVar11 == false) {
            local_90 = lVar13;
          }
          *psVar5 = (char)uVar2 + -0x30;
          uVar4 = (ulong)((int)uVar4 + 1);
          bVar11 = true;
          local_b8 = psVar5 + 1;
        }
        local_a8 = (decimal128_t *)((long)local_a8 + (ulong)bVar11);
        local_a0 = local_a0 + lVar9;
        lVar13 = lVar13 + 1;
        uVar2 = (uint)*pcVar20;
        bVar23 = uVar2 == 0x2e;
        pcVar21 = pcVar20;
        psVar5 = local_b8;
      } while (bVar23 || uVar2 - 0x30 < 10);
    }
    else {
      uVar4 = 0;
      local_90 = 0;
      local_a0 = (char *)0x0;
      local_a8 = (decimal128_t *)0x0;
      lVar13 = 0;
      bVar8 = 0;
    }
LAB_00207c8e:
    if ((lVar13 == 0 & bVar8) == 1) goto LAB_00207ca5;
    pcVar20 = local_a0;
    local_b0 = uVar6;
    if ((uVar2 & 0xff | 0x20) == 0x65) {
      pcVar20 = pcVar21 + 1;
      if (pcVar21[1] == '+') {
        pcVar20 = pcVar21 + 2;
      }
      local_b8 = psVar22;
      local_98 = uVar4;
      tVar25 = jsoncons::detail::to_integer<int,char>(pcVar20,(long)last - (long)pcVar20,&local_c4);
      pcVar21 = tVar25.ptr;
      if (tVar25.ec != success) {
        dec->low = 0;
        dec->high = 0x7c00000000000000;
        pcVar21 = pcVar20;
      }
      uVar6 = 0x16;
      uVar4 = local_98;
      psVar22 = local_b8;
      if (tVar25.ec != success) goto LAB_00207cb8;
    }
    if ((((long)last - (long)first == -1) || (pcVar21 < local_c0)) && (*pcVar21 != '\0'))
    goto LAB_00207ca5;
    uVar3 = (ulong)bVar8;
    if ((short)uVar4 == 0) {
      local_78 = local_78 & 0xffffffffffff0000;
      uVar4 = 1;
      uVar17 = 0;
      pdVar10 = (decimal128_t *)0x1;
      uVar12 = 0;
    }
    else {
      uVar4 = uVar4 & 0xffff;
      uVar12 = (long)local_a8 + 1;
      pcVar14 = first + (long)psVar22 + uVar3 + local_90 + (long)local_a8;
      do {
        pcVar14 = pcVar14 + -1;
        uVar12 = uVar12 - 1;
      } while (*pcVar14 == '0');
      uVar17 = (ulong)((int)uVar4 - 1);
      pdVar10 = local_a8;
    }
    iVar18 = (int)local_a0;
    iVar16 = -0x1820;
    if (-(local_c4 - iVar18) < 0x4001) {
      iVar16 = local_c4 - iVar18;
    }
    iVar15 = local_c4 - iVar18;
    bVar23 = local_c4 < iVar18;
    local_c4 = iVar15;
    if (iVar15 == 0 || bVar23) {
      local_c4 = iVar16;
    }
    iVar16 = local_c4;
    if (0x17df < local_c4) {
      do {
        uVar1 = uVar17;
        if (0x21 < uVar1) {
          if (uVar12 != 0) goto LAB_00207ca5;
          local_c4 = 0x17df;
          break;
        }
        local_c4 = iVar16 + -1;
        bVar23 = 0x17e0 < iVar16;
        uVar17 = uVar1 + 1;
        iVar16 = local_c4;
      } while (bVar23);
      uVar17 = uVar1 + 1;
    }
    bVar23 = uVar4 < pdVar10;
    if ((local_c4 < -0x1820) || (uVar4 < pdVar10)) {
      iVar16 = 0x17df;
      if (0x17df < local_c4) {
        iVar16 = local_c4;
      }
      iVar16 = iVar16 - local_c4;
      iVar18 = local_c4;
      do {
        if (uVar17 == 0) {
          if (uVar12 != 0) goto LAB_00207ca5;
          local_c4 = -0x1820;
          break;
        }
        if (bVar23) {
          if ((uVar12 != 0) && ((first + (long)psVar22)[(long)pdVar10 + (uVar3 - 1)] != '0'))
          goto LAB_00207ca5;
          pdVar10 = (decimal128_t *)((long)pdVar10 - 1);
        }
        else {
          if (*(short *)((long)&local_78 + uVar17 * 2) != 0) goto LAB_00207ca5;
          uVar17 = uVar17 - 1;
        }
        bVar23 = iVar16 == 0;
        iVar16 = iVar16 + -1;
        if (bVar23) goto LAB_00207ca5;
        local_c4 = iVar18 + 1;
        bVar23 = uVar4 < pdVar10;
        bVar11 = iVar18 < -0x1821;
        iVar18 = local_c4;
      } while ((bVar11) || (uVar4 < pdVar10));
    }
    if (uVar17 + 1 < uVar12) {
      cVar7 = first[(long)psVar22 + uVar3 + 1 + local_90 + uVar17];
      if (cVar7 != '0') {
        dec->low = 0;
        dec->high = 0x7c00000000000000;
        pcVar20 = pcVar21;
      }
      uVar6 = 0x16;
      if (cVar7 != '0') goto LAB_00207cb8;
    }
    cVar7 = (char)local_b0;
    if (uVar12 == 0) {
      uVar3 = 0;
LAB_00207fed:
      left = 0;
    }
    else {
      uVar4 = local_78 & 0xffff;
      if (uVar17 < 0x11) {
        uVar3 = uVar4;
        if (uVar17 == 0) goto LAB_00207fed;
        left = 0;
        uVar4 = 0;
        do {
          uVar3 = (ulong)*(ushort *)((long)&local_78 + uVar4 * 2 + 2) + uVar3 * 10;
          uVar4 = uVar4 + 1;
        } while (uVar17 != uVar4);
      }
      else {
        uVar12 = 1;
        if (uVar17 != 0x11) {
          uVar12 = uVar17 - 0x10;
          lVar13 = 0;
          do {
            uVar4 = (ulong)*(ushort *)((long)&local_78 + lVar13 * 2 + 2) + uVar4 * 10;
            lVar13 = lVar13 + 1;
          } while (uVar17 - 0x11 != lVar13);
        }
        uVar3 = (ulong)*(ushort *)((long)&local_78 + uVar12 * 2);
        while (uVar12 = uVar12 + 1, left = uVar4, uVar12 <= uVar17) {
          uVar3 = (ulong)*(ushort *)((long)&local_78 + uVar12 * 2) + uVar3 * 10;
        }
      }
    }
    detail::mul_64x64(left,100000000000000000,&local_88);
    if (CARRY8(uVar3,local_88.low)) {
      local_88.high = local_88.high + 1;
    }
    uVar12 = 0x1ffffffffffff;
    if ((local_88.high & 0x2000000000000) == 0) {
      uVar4 = (ulong)(local_c4 + 0x1820U & 0x3fff) << 0x31 | dec->high;
    }
    else {
      uVar4 = (ulong)(local_c4 + 0x1820U & 0xffff) << 0x2f | dec->high | 0x6000000000000000;
      uVar12 = 0x7fffffffffff;
    }
    uVar4 = local_88.high & uVar12 | uVar4;
    dec->high = uVar4;
    dec->low = uVar3 + local_88.low;
    uVar6 = 0;
    pcVar20 = pcVar21;
    if (cVar7 == '\0') goto LAB_00207cb8;
    uVar4 = uVar4 | 0x8000000000000000;
LAB_00207b7d:
    uVar6 = 0;
  }
  else {
    if (pcVar21 == last) goto LAB_00207ca5;
    cVar7 = first[(long)psVar22];
    local_a8 = dec;
    local_a0 = first;
    iVar16 = isupper((int)cVar7);
    cVar19 = cVar7 + ' ';
    if (iVar16 == 0) {
      cVar19 = cVar7;
    }
    iVar16 = isupper(0x69);
    cVar7 = -0x77;
    if (iVar16 == 0) {
      cVar7 = 'i';
    }
    if (cVar19 == cVar7) {
      lVar13 = 0;
      local_b8 = psVar22;
      local_b0 = uVar6;
      do {
        lVar9 = lVar13;
        pcVar20 = pcVar21 + lVar9 + 1;
        if ((pcVar20 == local_c0) || (lVar9 == 2)) break;
        cVar7 = *pcVar20;
        iVar16 = isupper((int)cVar7);
        if (iVar16 != 0) {
          cVar7 = cVar7 + ' ';
        }
        cVar19 = "inf"[lVar9 + 1];
        iVar16 = isupper((int)cVar19);
        if (iVar16 != 0) {
          cVar19 = cVar19 + ' ';
        }
        lVar13 = lVar9 + 1;
      } while (cVar7 == cVar19);
      uVar6 = local_b0;
      psVar22 = local_b8;
      if (pcVar20 != local_c0 || lVar9 != 2) goto LAB_00207a94;
LAB_00207b59:
      uVar4 = ((ulong)(byte)~(byte)local_b0 << 0x3f) + 0xf800000000000000;
LAB_00207b71:
      local_a8->low = 0;
      dec = local_a8;
      goto LAB_00207b7d;
    }
LAB_00207a94:
    dec = local_a8;
    if (pcVar21 == local_c0) goto LAB_00207ca5;
    cVar7 = local_a0[(long)psVar22];
    iVar16 = isupper((int)cVar7);
    cVar19 = cVar7 + ' ';
    if (iVar16 == 0) {
      cVar19 = cVar7;
    }
    iVar16 = isupper(0x69);
    cVar7 = -0x77;
    if (iVar16 == 0) {
      cVar7 = 'i';
    }
    if (cVar19 == cVar7) {
      lVar13 = 1;
      local_b8 = psVar22;
      local_b0 = uVar6;
      do {
        lVar9 = lVar13;
        pcVar20 = pcVar21 + lVar9;
        if ((pcVar20 == local_c0) || (lVar9 == 8)) break;
        cVar7 = *pcVar20;
        iVar16 = isupper((int)cVar7);
        if (iVar16 != 0) {
          cVar7 = cVar7 + ' ';
        }
        cVar19 = "test_decimal128_from_string__infinity"[lVar9 + 0x1d];
        iVar16 = isupper((int)cVar19);
        if (iVar16 != 0) {
          cVar19 = cVar19 + ' ';
        }
        lVar13 = lVar9 + 1;
      } while (cVar7 == cVar19);
      psVar22 = local_b8;
      if (pcVar20 == local_c0 && lVar9 == 8) goto LAB_00207b59;
    }
    dec = local_a8;
    if (pcVar21 != local_c0) {
      cVar7 = local_a0[(long)psVar22];
      iVar16 = isupper((int)cVar7);
      cVar19 = cVar7 + ' ';
      if (iVar16 == 0) {
        cVar19 = cVar7;
      }
      iVar16 = isupper(0x6e);
      cVar7 = -0x72;
      if (iVar16 == 0) {
        cVar7 = 'n';
      }
      dec = local_a8;
      if (cVar19 == cVar7) {
        lVar13 = 1;
        do {
          lVar9 = lVar13;
          pcVar20 = pcVar21 + lVar9;
          if ((pcVar20 == local_c0) || (lVar9 == 3)) break;
          cVar7 = *pcVar20;
          iVar16 = isupper((int)cVar7);
          if (iVar16 != 0) {
            cVar7 = cVar7 + ' ';
          }
          cVar19 = "nan"[lVar9];
          iVar16 = isupper((int)cVar19);
          if (iVar16 != 0) {
            cVar19 = cVar19 + ' ';
          }
          lVar13 = lVar9 + 1;
        } while (cVar7 == cVar19);
        dec = local_a8;
        if (pcVar20 == local_c0 && lVar9 == 3) {
          uVar4 = 0x7c00000000000000;
          goto LAB_00207b71;
        }
      }
    }
LAB_00207ca5:
    dec->low = 0;
LAB_00207cac:
    uVar4 = 0x7c00000000000000;
    uVar6 = 0x16;
  }
  dec->high = uVar4;
  pcVar20 = pcVar21;
LAB_00207cb8:
  dVar24._8_8_ = uVar6;
  dVar24.ptr = pcVar20;
  return dVar24;
}

Assistant:

inline
    decimal128_from_chars_result decimal128_from_chars(const char* first, const char* last, decimal128_t& dec) 
    {
        const string_view inf_str = "inf";
        const string_view infinity_str = "infinity";
        const string_view nan_str = "nan";

        ptrdiff_t len = last - first;

        bson_uint128_6464_t significand = {0,0};
 
        const char* str_read = first; /* Read pointer for consuming str. */
 
        /* Parsing state tracking */
        bool is_negative = false;
        bool saw_radix = false;
        bool includes_sign = false; /* True if the input first contains a sign. */
        bool found_nonzero = false;
 
        std::size_t significant_digits = 0; /* Total number of significant digits
                                        * (no leading or trailing zero) */
        std::size_t ndigits_read = 0;       /* Total number of significand digits read */
        std::size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
        std::size_t radix_position = 0; /* The number of the digits after radix */
        std::size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */
 
        uint16_t digits[decimal128_limits::max_digits] = {0};
        uint16_t ndigits_stored = 0;      /* The number of digits in digits */
        uint16_t *digits_insert = digits; /* Insertion pointer for digits */
        std::size_t first_digit = 0;           /* The index of the first non-zero digit */
        std::size_t last_digit = 0;            /* The index of the last digit */
 
        int32_t exponent = 0;
        uint64_t significand_high = 0; /* The high 17 digits of the significand */
        uint64_t significand_low = 0;  /* The low 17 digits of the significand */
        uint16_t biased_exponent = 0;  /* The biased exponent */
 
        dec.high = 0;
        dec.low = 0;
 
        if (*str_read == '+' || *str_read == '-') {
           is_negative = *(str_read++) == '-';
           includes_sign = true;
        }

        /* Check for Infinity or NaN */
        if (!isdigit(*str_read) && *str_read != '.') {
           if (detail::dec128_istreq (str_read, last, inf_str.data(), inf_str.data()+inf_str.length()) ||
               detail::dec128_istreq (str_read, last, infinity_str.data(), infinity_str.data()+infinity_str.length())) 
           {
               dec = is_negative ? decimal128_limits::neg_infinity() : decimal128_limits::infinity();
              return decimal128_from_chars_result{str_read,std::errc()};
           } else if (detail::dec128_istreq (str_read, last, nan_str.data(), nan_str.data()+nan_str.length())) {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc()};
           }
 
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read digits */
        while (((isdigit (*str_read) || *str_read == '.')) &&
               (len == -1 || str_read < first + len)) {
           if (*str_read == '.') {
              if (saw_radix) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              saw_radix = true;
              str_read++;
              continue;
           }
 
           if (ndigits_stored < 34) {
              if (*str_read != '0' || found_nonzero) {
                 if (!found_nonzero) {
                    first_nonzero = ndigits_read;
                 }
 
                 found_nonzero = true;
                 *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
                 ndigits_stored++;
              }
           }
 
           if (found_nonzero) {
              ndigits++;
           }
 
           if (saw_radix) {
              radix_position++;
           }
 
           ndigits_read++;
           str_read++;
        }
 
        if (saw_radix && !ndigits_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read exponent if exists */
        if (*str_read == 'e' || *str_read == 'E') {
           ++str_read;
           if (*str_read == '+') {
               ++str_read;
           }
           auto result = jsoncons::detail::to_integer(str_read, last - str_read, exponent);
           if (result.ec != jsoncons::detail::to_integer_errc()) 
           {
               dec = decimal128_limits::nan();
               return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
           str_read = result.ptr;
        }

        if ((len == -1 || str_read < first + len) && *str_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Done reading input. */
        /* Find first non-zero digit in digits */
        first_digit = 0;
 
        if (!ndigits_stored) { /* value is zero */
           first_digit = 0;
           last_digit = 0;
           digits[0] = 0;
           ndigits = 1;
           ndigits_stored = 1;
           significant_digits = 0;
        } else {
           last_digit = ndigits_stored - 1;
           significant_digits = ndigits;
           /* Mark trailing zeros as non-significant */
           while (first[first_nonzero + significant_digits - 1 + includes_sign +
                         saw_radix] == '0') {
              significant_digits--;
           }
        }
 
 
        /* Normalization of exponent */
        /* Correct exponent based on radix position, and shift significand as needed
         */
        /* to represent user input */
 
        /* Overflow prevention */
        if (exponent <= static_cast<int32_t>(radix_position) && static_cast<int32_t>(radix_position) - exponent > (1 << 14)) {
           exponent = decimal128_limits::exponent_min;
        } else {
           exponent -= static_cast<int32_t>(radix_position);
        }
 
        /* Attempt to normalize the exponent */
        while (exponent > decimal128_limits::exponent_max) {
           /* Shift exponent to significand and decrease */
           last_digit++;
 
           if (last_digit - first_digit > decimal128_limits::max_digits) {
              /* The exponent is too great to shift into the significand. */
              if (significant_digits == 0) {
                 /* Value is zero, we are allowed to clamp the exponent. */
                 exponent = decimal128_limits::exponent_max;
                 break;
              }
 
              /* Overflow is not permitted, error. */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           exponent--;
        }
 
        while (exponent < decimal128_limits::exponent_min || ndigits_stored < ndigits) {
           /* Shift last digit */
           if (last_digit == 0) {
              /* underflow is not allowed, but zero clamping is */
              if (significant_digits == 0) {
                 exponent = decimal128_limits::exponent_min;
                 break;
              }
 
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           if (ndigits_stored < ndigits) {
              if (first[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
                  significant_digits != 0) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              ndigits--; /* adjust to match digits not stored */
           } else {
              if (digits[last_digit] != 0) {
                 /* Inexact rounding is not allowed. */
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
 
              last_digit--; /* adjust to round */
           }
 
           if (exponent < decimal128_limits::exponent_max) {
              exponent++;
           } else {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Round */
        /* We've normalized the exponent, but might still need to round. */
        if (last_digit - first_digit + 1 < significant_digits) {
           uint8_t round_digit;
 
           /* There are non-zero digits after last_digit that need rounding. */
           /* We round to nearest, ties to even */
           round_digit =
              first[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
              '0';
 
           if (round_digit != 0) {
              /* Inexact (non-zero) rounding is not allowed */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Encode significand */
        significand_high = 0,   /* The high 17 digits of the significand */
           significand_low = 0; /* The low 17 digits of the significand */
 
        if (significant_digits == 0) { /* read a zero */
           significand_high = 0;
           significand_low = 0;
        } else if (last_digit - first_digit < 17) {
           std::size_t d_idx = first_digit;
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
              significand_high = 0;
           }
        } else {
           std::size_t d_idx = first_digit;
           significand_high = digits[d_idx++];
 
           for (; d_idx <= last_digit - 17; d_idx++) {
              significand_high *= 10;
              significand_high += digits[d_idx];
           }
 
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
           }
        }
 
        detail::mul_64x64 (significand_high, 100000000000000000ull, &significand);
        significand.low += significand_low;
 
        if (significand.low < significand_low) {
           significand.high += 1;
        }
 
 
        biased_exponent = static_cast<uint16_t>(exponent + static_cast<int32_t>(decimal128_limits::exponent_bias));
 
        /* Encode combination, exponent, and significand. */
        if ((significand.high >> 49) & 1) {
           /* Encode '11' into bits 1 to 3 */
           dec.high |= (0x3ull << 61);
           dec.high |= (biased_exponent & 0x3fffull) << 47;
           dec.high |= significand.high & 0x7fffffffffffull;
        } else {
           dec.high |= (biased_exponent & 0x3fffull) << 49;
           dec.high |= significand.high & 0x1ffffffffffffull;
        }
 
        dec.low = significand.low;
 
        /* Encode sign */
        if (is_negative) {
           dec.high |= 0x8000000000000000ull;
        }
 
        return decimal128_from_chars_result{str_read,std::errc()};
    }